

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch.h
# Opt level: O0

void dual_inner_prod(opus_val16 *x,opus_val16 *y01,opus_val16 *y02,int N,opus_val32 *xy1,
                    opus_val32 *xy2)

{
  float local_44;
  float local_40;
  opus_val32 xy02;
  opus_val32 xy01;
  int i;
  opus_val32 *xy2_local;
  opus_val32 *xy1_local;
  int N_local;
  opus_val16 *y02_local;
  opus_val16 *y01_local;
  opus_val16 *x_local;
  
  local_40 = 0.0;
  local_44 = 0.0;
  for (xy02 = 0.0; (int)xy02 < N; xy02 = (opus_val32)((int)xy02 + 1)) {
    local_40 = x[(int)xy02] * y01[(int)xy02] + local_40;
    local_44 = x[(int)xy02] * y02[(int)xy02] + local_44;
  }
  *xy1 = (opus_val32)local_40;
  *xy2 = (opus_val32)local_44;
  return;
}

Assistant:

static OPUS_INLINE void dual_inner_prod(const opus_val16 *x, const opus_val16 *y01, const opus_val16 *y02,
                                        int N, opus_val32 *xy1, opus_val32 *xy2) {
    int i;
    opus_val32 xy01 = 0;
    opus_val32 xy02 = 0;
    for (i = 0; i < N; i++) {
        xy01 = MAC16_16(xy01, x[i], y01[i]);
        xy02 = MAC16_16(xy02, x[i], y02[i]);
    }
    *xy1 = xy01;
    *xy2 = xy02;
}